

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

string * __thiscall
cs_impl::path_cs_ext::name_abi_cxx11_
          (string *__return_storage_ptr__,path_cs_ext *this,path_info *info)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string name(const path_info &info)
		{
			return info.name;
		}